

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2pointutil.cc
# Opt level: O0

S2Point * S2::Ortho(S2Point *__return_storage_ptr__,S2Point *a)

{
  int iVar1;
  double *pdVar2;
  Vector3<double> local_48;
  undefined1 local_30 [8];
  S2Point temp;
  int k;
  S2Point *a_local;
  
  iVar1 = Vector3<double>::LargestAbsComponent(a);
  temp.c_[2]._4_4_ = iVar1 + -1;
  if (temp.c_[2]._4_4_ < 0) {
    temp.c_[2]._4_4_ = 2;
  }
  Vector3<double>::Vector3((Vector3<double> *)local_30,0.012,0.0053,0.00457);
  pdVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                     ((BasicVector<Vector3,_double,_3UL> *)local_30,temp.c_[2]._4_4_);
  *pdVar2 = 1.0;
  Vector3<double>::CrossProd(&local_48,a,(Vector3<double> *)local_30);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
            (__return_storage_ptr__,(BasicVector<Vector3,_double,_3UL> *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

S2Point Ortho(const S2Point& a) {
#ifdef S2_TEST_DEGENERACIES
  // Vector3::Ortho() always returns a point on the X-Y, Y-Z, or X-Z planes.
  // This leads to many more degenerate cases in polygon operations.
  return a.Ortho();
#else
  int k = a.LargestAbsComponent() - 1;
  if (k < 0) k = 2;
  S2Point temp(0.012, 0.0053, 0.00457);
  temp[k] = 1;
  return a.CrossProd(temp).Normalize();
#endif
}